

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::MapRangeWriteBitTest::iterate(MapRangeWriteBitTest *this)

{
  uint uVar1;
  uint uVar2;
  PFNGLNAMEDBUFFERSTORAGE p_Var3;
  PFNGLMAPNAMEDBUFFERRANGE p_Var4;
  PFNGLUNMAPNAMEDBUFFER p_Var5;
  PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE p_Var6;
  bool bVar7;
  byte bVar8;
  GLsizei j;
  int iVar9;
  ContextType ctxType;
  deUint32 dVar10;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  void *pvVar12;
  long lVar13;
  undefined4 *puVar14;
  char *description;
  GLuint i;
  long lVar15;
  ulong uVar16;
  qpTestResult testResult;
  TestContext *this_00;
  undefined1 auVar17 [16];
  GLuint buffer;
  GLuint local_44;
  MapRangeWriteBitTest *local_40;
  undefined4 local_34;
  long lVar11;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var_00,iVar9);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(ctxType,(ApiType)0x154);
  uVar16 = CONCAT71(extraout_var,bVar7) & 0xffffffff;
  local_40 = this;
  bVar7 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if (((char)uVar16 != '\0') || (bVar7)) {
    local_44 = 0;
    p_Var3 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar11 + 0xed8);
    local_40->m_pNamedBufferStorage = p_Var3;
    p_Var4 = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar11 + 0xd10);
    local_40->m_pMapNamedBufferRange = p_Var4;
    p_Var5 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar11 + 0x1678);
    local_40->m_pUnmapNamedBuffer = p_Var5;
    p_Var6 = *(PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE *)(lVar11 + 0x660);
    local_40->m_pFlushMappedNamedBufferRange = p_Var6;
    auVar17._0_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == 0 && (int)p_Var3 == 0);
    auVar17._4_4_ = -(uint)((int)p_Var4 == 0 && (int)((ulong)p_Var4 >> 0x20) == 0);
    auVar17._8_4_ = -(uint)((int)((ulong)p_Var5 >> 0x20) == 0 && (int)p_Var5 == 0);
    auVar17._12_4_ = -(uint)((int)p_Var6 == 0 && (int)((ulong)p_Var6 >> 0x20) == 0);
    iVar9 = movmskps((int)p_Var3,auVar17);
    if (iVar9 != 0) {
      puVar14 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar14 = 0;
      __cxa_throw(puVar14,&int::typeinfo,0);
    }
    uVar16 = CONCAT71((int7)(uVar16 >> 8),1);
    lVar15 = 0;
    do {
      local_34 = (undefined4)uVar16;
      (**(code **)(lVar11 + 0x3b8))(1,&local_44);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x771);
      (*local_40->m_pNamedBufferStorage)(local_44,0x30,(GLvoid *)0x0,(&DAT_01ac1db0)[lVar15 * 3]);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"glNamedBufferStorage failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x775);
      uVar1 = (&DAT_01ac1db4)[lVar15 * 3];
      pvVar12 = (*local_40->m_pMapNamedBufferRange)(local_44,0,0x18,uVar1);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"glMapNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x77a);
      lVar13 = 0;
      do {
        *(undefined4 *)((long)pvVar12 + lVar13) = *(undefined4 *)((long)&s_reference + lVar13);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x18);
      dVar10 = 0;
      if ((uVar1 & 0x10) != 0) {
        (*local_40->m_pFlushMappedNamedBufferRange)(local_44,0,0x18);
        dVar10 = (**(code **)(lVar11 + 0x800))();
      }
      (*local_40->m_pUnmapNamedBuffer)(local_44);
      glu::checkError(dVar10,"glFlushMappedNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x78e);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x78f);
      uVar2 = (&DAT_01ac1db8)[lVar15 * 3];
      pvVar12 = (*local_40->m_pMapNamedBufferRange)(local_44,0x18,0x18,uVar2);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"glMapNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x794);
      lVar13 = 0;
      do {
        *(undefined4 *)((long)pvVar12 + lVar13 * 4) = (&DAT_01ac1e08)[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 6);
      dVar10 = 0;
      if ((uVar2 & 0x10) != 0) {
        (*local_40->m_pFlushMappedNamedBufferRange)(local_44,0,0x18);
        dVar10 = (**(code **)(lVar11 + 0x800))();
      }
      (*local_40->m_pUnmapNamedBuffer)(local_44);
      glu::checkError(dVar10,"glFlushMappedNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x7a8);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x7a9);
      bVar7 = CompareWithReference(local_40,local_44,uVar2 | uVar1);
      if (local_44 != 0) {
        (**(code **)(lVar11 + 0x438))(1);
        local_44 = 0;
      }
      bVar8 = (byte)local_34 & bVar7;
      uVar16 = (ulong)CONCAT31((int3)((uint)local_34 >> 8),bVar8);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 5);
    do {
      iVar9 = (**(code **)(lVar11 + 0x800))();
    } while (iVar9 != 0);
    this_00 = (local_40->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar8 == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (local_40->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapRangeWriteBitTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferStorage		   = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pMapNamedBufferRange		   = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pUnmapNamedBuffer			   = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;
	m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)gl.flushMappedNamedBufferRange;

	try
	{
		if ((DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pMapNamedBufferRange) ||
			(DE_NULL == m_pUnmapNamedBuffer) || (DE_NULL == m_pFlushMappedNamedBufferRange))
		{
			throw 0;
		}

		struct
		{
			glw::GLbitfield creation;
			glw::GLbitfield first_mapping;
			glw::GLbitfield second_mapping;
		} access_flags[] = {
			{ GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, GL_MAP_WRITE_BIT, GL_MAP_WRITE_BIT },
			{ GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT,
			  GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT },
			{ GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT, GL_MAP_WRITE_BIT },
			{ GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT,
			  GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT },
			{ GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, GL_MAP_WRITE_BIT, GL_MAP_WRITE_BIT | GL_MAP_UNSYNCHRONIZED_BIT }
		};

		glw::GLuint access_flags_count = sizeof(access_flags) / sizeof(access_flags[0]);

		for (glw::GLuint i = 0; i < access_flags_count; ++i)
		{
			/* Buffer creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Buffer's storage allocation and reference data upload. */
			m_pNamedBufferStorage(buffer, s_reference_size, DE_NULL, access_flags[i].creation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferStorage failed.");

			/* Mapping with first half of named buffer. */
			glw::GLuint* data =
				(glw::GLuint*)m_pMapNamedBufferRange(buffer, 0, s_reference_size / 2, access_flags[i].first_mapping);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange failed.");

			/* Write to mapped buffer. */
			for (glw::GLsizei j = 0; j < s_reference_count / 2; ++j)
			{
				data[j] = s_reference[j];
			}

			/* Flush, if needed. */
			glw::GLenum flush_error = GL_NO_ERROR;

			if (GL_MAP_FLUSH_EXPLICIT_BIT & access_flags[i].first_mapping)
			{
				m_pFlushMappedNamedBufferRange(buffer, 0, s_reference_size / 2);

				flush_error = gl.getError();
			}

			/* Unmapping with new named buffer unmap function. */
			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(flush_error, "glFlushMappedNamedBufferRange failed.");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			/* Mapping with second half of named buffer. */
			data = (glw::GLuint*)m_pMapNamedBufferRange(buffer, s_reference_size / 2, s_reference_size / 2,
														access_flags[i].second_mapping);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange failed.");

			/* Write to mapped buffer. */
			for (glw::GLsizei j = 0; j < s_reference_count / 2; ++j)
			{
				data[j] = s_reference[j + s_reference_count / 2];
			}

			/* Flush, if needed. */
			flush_error = GL_NO_ERROR;

			if (GL_MAP_FLUSH_EXPLICIT_BIT & access_flags[i].second_mapping)
			{
				m_pFlushMappedNamedBufferRange(buffer, 0, s_reference_size / 2);

				flush_error = gl.getError();
			}

			/* Unmapping with new named buffer unmap function. */
			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(flush_error, "glFlushMappedNamedBufferRange failed.");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			/* Check that previous mappings correctly filled buffer with reference data. */
			is_ok &= CompareWithReference(buffer, access_flags[i].first_mapping | access_flags[i].second_mapping);

			/* Clean up. */
			if (buffer)
			{
				gl.deleteBuffers(1, &buffer);

				buffer = 0;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}